

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorDelete(unqlite_kv_cursor *pCursor)

{
  lhcell *pCell_00;
  int rc;
  lhcell *pCell;
  lhash_kv_cursor *pCur;
  unqlite_kv_cursor *pCursor_local;
  
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    pCell_00 = (lhcell *)pCursor[2].pStore;
    pCursor[2].pStore = (unqlite_kv_engine *)pCell_00->pNext;
    pCursor_local._4_4_ = lhRecordRemove(pCell_00);
  }
  else {
    pCursor_local._4_4_ = -9;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorDelete(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell  */
	pCell = pCur->pCell;
	/* Point to the next entry */
	pCur->pCell = pCell->pNext;
	/* Perform the deletion */
	rc = lhRecordRemove(pCell);
	return rc;
}